

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O1

uint64_t aom_sum_squares_i16_64n_sse2(int16_t *src,uint32_t n)

{
  undefined1 (*pauVar1) [16];
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (n == 0) {
    lVar2 = 0;
    lVar3 = 0;
  }
  else {
    pauVar1 = (undefined1 (*) [16])(src + n);
    lVar2 = 0;
    lVar3 = 0;
    lVar4 = 0;
    lVar5 = 0;
    do {
      auVar8 = pmaddwd(*(undefined1 (*) [16])src,*(undefined1 (*) [16])src);
      auVar9 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x10),
                       *(undefined1 (*) [16])((long)src + 0x10));
      auVar10 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x20),
                        *(undefined1 (*) [16])((long)src + 0x20));
      auVar11 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x30),
                        *(undefined1 (*) [16])((long)src + 0x30));
      auVar12 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x40),
                        *(undefined1 (*) [16])((long)src + 0x40));
      auVar13 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x50),
                        *(undefined1 (*) [16])((long)src + 0x50));
      auVar14 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x60),
                        *(undefined1 (*) [16])((long)src + 0x60));
      auVar6 = pmaddwd(*(undefined1 (*) [16])((long)src + 0x70),
                       *(undefined1 (*) [16])((long)src + 0x70));
      auVar7._0_4_ = auVar6._0_4_ +
                     auVar14._0_4_ + auVar13._0_4_ + auVar12._0_4_ +
                     auVar11._0_4_ + auVar10._0_4_ + auVar9._0_4_ + auVar8._0_4_;
      auVar7._4_4_ = auVar6._4_4_ +
                     auVar14._4_4_ + auVar13._4_4_ + auVar12._4_4_ +
                     auVar11._4_4_ + auVar10._4_4_ + auVar9._4_4_ + auVar8._4_4_;
      auVar7._8_4_ = auVar6._8_4_ +
                     auVar14._8_4_ + auVar13._8_4_ + auVar12._8_4_ +
                     auVar11._8_4_ + auVar10._8_4_ + auVar9._8_4_ + auVar8._8_4_;
      auVar7._12_4_ =
           auVar6._12_4_ +
           auVar14._12_4_ + auVar13._12_4_ + auVar12._12_4_ +
           auVar11._12_4_ + auVar10._12_4_ + auVar9._12_4_ + auVar8._12_4_;
      lVar2 = lVar2 + SUB168(auVar7 & _DAT_004df290,0);
      lVar3 = lVar3 + SUB168(auVar7 & _DAT_004df290,8);
      lVar4 = lVar4 + (ulong)auVar7._4_4_;
      lVar5 = lVar5 + (auVar7._8_8_ >> 0x20);
      src = (int16_t *)((long)src + 0x80);
    } while (src < pauVar1);
    lVar2 = lVar2 + lVar4;
    lVar3 = lVar3 + lVar5;
  }
  return lVar3 + lVar2;
}

Assistant:

static uint64_t aom_sum_squares_i16_64n_sse2(const int16_t *src, uint32_t n) {
  const __m128i v_zext_mask_q = _mm_set1_epi64x(~0u);
  __m128i v_acc0_q = _mm_setzero_si128();
  __m128i v_acc1_q = _mm_setzero_si128();

  const int16_t *const end = src + n;

  assert(n % 64 == 0);

  while (src < end) {
    const __m128i v_val_0_w = xx_load_128(src);
    const __m128i v_val_1_w = xx_load_128(src + 8);
    const __m128i v_val_2_w = xx_load_128(src + 16);
    const __m128i v_val_3_w = xx_load_128(src + 24);
    const __m128i v_val_4_w = xx_load_128(src + 32);
    const __m128i v_val_5_w = xx_load_128(src + 40);
    const __m128i v_val_6_w = xx_load_128(src + 48);
    const __m128i v_val_7_w = xx_load_128(src + 56);

    const __m128i v_sq_0_d = _mm_madd_epi16(v_val_0_w, v_val_0_w);
    const __m128i v_sq_1_d = _mm_madd_epi16(v_val_1_w, v_val_1_w);
    const __m128i v_sq_2_d = _mm_madd_epi16(v_val_2_w, v_val_2_w);
    const __m128i v_sq_3_d = _mm_madd_epi16(v_val_3_w, v_val_3_w);
    const __m128i v_sq_4_d = _mm_madd_epi16(v_val_4_w, v_val_4_w);
    const __m128i v_sq_5_d = _mm_madd_epi16(v_val_5_w, v_val_5_w);
    const __m128i v_sq_6_d = _mm_madd_epi16(v_val_6_w, v_val_6_w);
    const __m128i v_sq_7_d = _mm_madd_epi16(v_val_7_w, v_val_7_w);

    const __m128i v_sum_01_d = _mm_add_epi32(v_sq_0_d, v_sq_1_d);
    const __m128i v_sum_23_d = _mm_add_epi32(v_sq_2_d, v_sq_3_d);
    const __m128i v_sum_45_d = _mm_add_epi32(v_sq_4_d, v_sq_5_d);
    const __m128i v_sum_67_d = _mm_add_epi32(v_sq_6_d, v_sq_7_d);

    const __m128i v_sum_0123_d = _mm_add_epi32(v_sum_01_d, v_sum_23_d);
    const __m128i v_sum_4567_d = _mm_add_epi32(v_sum_45_d, v_sum_67_d);

    const __m128i v_sum_d = _mm_add_epi32(v_sum_0123_d, v_sum_4567_d);

    v_acc0_q = _mm_add_epi64(v_acc0_q, _mm_and_si128(v_sum_d, v_zext_mask_q));
    v_acc1_q = _mm_add_epi64(v_acc1_q, _mm_srli_epi64(v_sum_d, 32));

    src += 64;
  }

  v_acc0_q = _mm_add_epi64(v_acc0_q, v_acc1_q);
  v_acc0_q = _mm_add_epi64(v_acc0_q, _mm_srli_si128(v_acc0_q, 8));
  return xx_cvtsi128_si64(v_acc0_q);
}